

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O1

void Acec_CreateBoxTest(Gia_Man_t *p)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  void *__ptr;
  Vec_Wec_t *__ptr_00;
  int iVar3;
  uint uVar4;
  Vec_Int_t *vAdds;
  Acec_Box_t *pBox;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  timespec ts;
  timespec local_50;
  Gia_Man_t *local_40;
  Vec_Wec_t *local_38;
  
  local_40 = p;
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  vAdds = Ree_ManComputeCuts(local_40,(Vec_Int_t **)0x0,1);
  uVar4 = Ree_ManCountFadds(vAdds);
  printf("Detected %d adders (%d FAs and %d HAs).  ",(ulong)(uint)(vAdds->nSize / 6),(ulong)uVar4);
  iVar8 = 3;
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  uVar4 = 0;
  Abc_Print(iVar8,"%s =","Time");
  Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar12 + lVar6) / 1000000.0);
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar6 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  local_38 = Acec_TreeFindTrees(local_40,vAdds,(Vec_Bit_t *)0x0,0,0);
  uVar1 = local_38->nSize;
  uVar13 = (ulong)(int)uVar1;
  if (0 < (long)uVar13) {
    lVar12 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + *(int *)((long)&local_38->pArray->nSize + lVar12);
      lVar12 = lVar12 + 0x10;
    } while (uVar13 << 4 != lVar12);
    uVar4 = iVar3 / 2;
  }
  printf("Collected %d trees with %d adders in them.  ",(ulong)uVar1,(ulong)uVar4);
  iVar8 = 3;
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  Abc_Print(iVar8,"%s =","Time");
  Abc_Print(iVar8,"%9.2f sec\n",(double)(lVar12 + lVar6) / 1000000.0);
  if (0 < (int)uVar1) {
    pVVar2 = local_38->pArray;
    uVar7 = 0;
    do {
      pBox = Acec_CreateBox(local_40,vAdds,pVVar2 + uVar7);
      lVar6 = (long)pBox->vAdds->nSize;
      uVar5 = 0;
      if (0 < lVar6) {
        lVar12 = 0;
        uVar5 = 0;
        do {
          uVar5 = (ulong)(uint)((int)uVar5 + *(int *)((long)&pBox->vAdds->pArray->nSize + lVar12));
          lVar12 = lVar12 + 0x10;
        } while (lVar6 << 4 != lVar12);
      }
      lVar12 = (long)pBox->vLeafLits->nSize;
      uVar11 = 0;
      uVar10 = 0;
      if (0 < lVar12) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          uVar10 = (ulong)(uint)((int)uVar10 +
                                *(int *)((long)&pBox->vLeafLits->pArray->nSize + lVar9));
          lVar9 = lVar9 + 0x10;
        } while (lVar12 * 0x10 != lVar9);
      }
      lVar12 = (long)pBox->vRootLits->nSize;
      if (0 < lVar12) {
        lVar9 = 0;
        uVar11 = 0;
        do {
          uVar11 = (ulong)(uint)((int)uVar11 +
                                *(int *)((long)&pBox->vRootLits->pArray->nSize + lVar9));
          lVar9 = lVar9 + 0x10;
        } while (lVar12 * 0x10 != lVar9);
      }
      printf("Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n",
             uVar7 & 0xffffffff,lVar6,uVar5,uVar10,uVar11);
      Acec_TreePrintBox(pBox,vAdds);
      if (pBox != (Acec_Box_t *)0x0) {
        Acec_BoxFree(pBox);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar13);
  }
  __ptr_00 = local_38;
  iVar3 = local_38->nCap;
  if (0 < (long)iVar3) {
    pVVar2 = local_38->pArray;
    lVar6 = 0;
    do {
      __ptr = *(void **)((long)&pVVar2->pArray + lVar6);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar2->pArray + lVar6) = 0;
      }
      lVar6 = lVar6 + 0x10;
    } while ((long)iVar3 * 0x10 != lVar6);
  }
  if (__ptr_00->pArray != (Vec_Int_t *)0x0) {
    free(__ptr_00->pArray);
    __ptr_00->pArray = (Vec_Int_t *)0x0;
  }
  __ptr_00->nCap = 0;
  __ptr_00->nSize = 0;
  free(__ptr_00);
  if (vAdds->pArray != (int *)0x0) {
    free(vAdds->pArray);
    vAdds->pArray = (int *)0x0;
  }
  if (vAdds != (Vec_Int_t *)0x0) {
    free(vAdds);
  }
  return;
}

Assistant:

void Acec_CreateBoxTest( Gia_Man_t * p )
{
    Acec_Box_t * pBox;
    Vec_Wec_t * vTrees;
    Vec_Int_t * vTree;

    abctime clk = Abc_Clock();
    Vec_Int_t * vAdds = Ree_ManComputeCuts( p, NULL, 1 );
    int i, nFadds = Ree_ManCountFadds( vAdds );
    printf( "Detected %d adders (%d FAs and %d HAs).  ", Vec_IntSize(vAdds)/6, nFadds, Vec_IntSize(vAdds)/6-nFadds );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );

    clk = Abc_Clock();
    vTrees = Acec_TreeFindTrees( p, vAdds, NULL, 0, 0 );
    printf( "Collected %d trees with %d adders in them.  ", Vec_WecSize(vTrees), Vec_WecSizeSize(vTrees)/2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    //Vec_WecPrint( vTrees, 0 );

    Vec_WecForEachLevel( vTrees, vTree, i )
    {
        pBox = Acec_CreateBox( p, vAdds, Vec_WecEntry(vTrees, i) );
        printf( "Processing tree %d:  Ranks = %d.  Adders = %d.  Leaves = %d.  Roots = %d.\n", 
            i, Vec_WecSize(pBox->vAdds), Vec_WecSizeSize(pBox->vAdds), 
            Vec_WecSizeSize(pBox->vLeafLits), Vec_WecSizeSize(pBox->vRootLits)  );
        Acec_TreePrintBox( pBox, vAdds );
        Acec_BoxFreeP( &pBox );
    }

    Vec_WecFree( vTrees );
    Vec_IntFree( vAdds );
}